

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstr.c
# Opt level: O1

char * bstr_make_cstr_x(uint8_t *pBegin,uint8_t *pEnd,uint16_t beginOffset,uint16_t endOffset)

{
  char *pcVar1;
  int iVar2;
  
  if (pEnd == (uint8_t *)0x0 || pBegin == (uint8_t *)0x0) {
    pcVar1 = (char *)0x0;
  }
  else {
    iVar2 = (int)((long)pEnd - (long)pBegin) + (uint)beginOffset;
    pcVar1 = (char *)malloc((ulong)(iVar2 + (uint)endOffset + 1));
    if (pcVar1 != (char *)0x0) {
      memcpy(pcVar1 + beginOffset,pBegin,(long)pEnd - (long)pBegin & 0xffffffff);
      pcVar1[iVar2 + (uint)endOffset] = '\0';
    }
  }
  return pcVar1;
}

Assistant:

char *bstr_make_cstr_x(const uint8_t *pBegin, const uint8_t *pEnd, uint16_t beginOffset, uint16_t endOffset){
   if( (pBegin != 0) && (pEnd != 0) && (pBegin)){
      uint8_t *str;
      uint32_t allocLen;
      uint32_t strLen = (uint32_t) (pEnd-pBegin);
      allocLen = strLen+beginOffset+endOffset+1;
      str = (uint8_t*) malloc(allocLen);
      if(str != 0){
         memcpy(str+beginOffset,pBegin,strLen);
         str[allocLen-1]=(uint8_t)0;
      }
      return (char*)str;
   }
   return 0;
}